

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *localGenerators)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar2;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> target;
  cmQtAutoGenGlobalInitializer *this_01;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  string *psVar7;
  size_type sVar8;
  char *str;
  undefined1 rcc;
  string *in_R8;
  pointer puVar9;
  byte bVar10;
  pointer puVar11;
  pointer puVar12;
  bool bVar13;
  bool bVar14;
  bool rccIsValid;
  bool uicIsValid;
  bool mocIsValid;
  bool globalAutoRccTarget;
  bool globalAutoGenTarget;
  byte local_1c1;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> local_1c0 [2];
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_1a8;
  cmQtAutoGenGlobalInitializer *local_1a0;
  string *local_198;
  string *local_190;
  ConfigStrings<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>_>
  *local_188;
  pointer local_180;
  string *local_178;
  string *local_170;
  string *local_168;
  pointer local_160;
  string *local_158;
  string *local_150;
  pointer local_148;
  string *local_140;
  string *local_138;
  string targetName;
  cmAlphaNum component;
  string msg;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_70;
  string local_50;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoGenTargets_;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1c0[1]._4_8_ = &this->GlobalAutoRccTargets_;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188 = &this->CompilerFeatures_;
  cmQtAutoGen::
  ConfigStrings<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>_>
  ::ConfigStrings(local_188);
  local_198 = &(this->Keywords_).AUTOMOC;
  local_1a0 = this;
  Keywords::Keywords((Keywords *)local_198);
  puVar11 = (localGenerators->
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_180 = (localGenerators->
              super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_138 = &(this->Keywords_).AUTOUIC;
  local_140 = &(this->Keywords_).AUTORCC;
  local_168 = &(this->Keywords_).AUTOMOC_EXECUTABLE;
  local_170 = &(this->Keywords_).AUTOUIC_EXECUTABLE;
  local_178 = &(this->Keywords_).AUTORCC_EXECUTABLE;
  while( true ) {
    if (puVar11 == local_180) break;
    globalAutoGenTarget = false;
    globalAutoRccTarget = false;
    this_00 = ((puVar11->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET",(allocator<char> *)&component);
    bVar3 = cmMakefile::IsOn(this_00,&targetName);
    std::__cxx11::string::~string((string *)&targetName);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&component,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME",
                 (allocator<char> *)&local_a0);
      psVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)&component);
      std::__cxx11::string::string((string *)&targetName,(string *)psVar7);
      std::__cxx11::string::~string((string *)&component);
      if (targetName._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&targetName);
      }
      component.RValueString_ =
           (string *)
           (puVar11->_M_t).
           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
           super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      std::
      _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                (local_1a8,(cmLocalGenerator **)&component,&targetName);
      globalAutoGenTarget = true;
      std::__cxx11::string::~string((string *)&targetName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET",(allocator<char> *)&component);
    bVar3 = cmMakefile::IsOn(this_00,&targetName);
    std::__cxx11::string::~string((string *)&targetName);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&component,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME",
                 (allocator<char> *)&local_a0);
      psVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)&component);
      std::__cxx11::string::string((string *)&targetName,(string *)psVar7);
      std::__cxx11::string::~string((string *)&component);
      if (targetName._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&targetName);
      }
      component.RValueString_ =
           (string *)
           (puVar11->_M_t).
           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
           super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      std::
      _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                ((_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                  *)local_1c0[1]._4_8_,(cmLocalGenerator **)&component,&targetName);
      globalAutoRccTarget = true;
      std::__cxx11::string::~string((string *)&targetName);
    }
    pcVar2 = (puVar11->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar12 = *(pointer *)
               &(pcVar2->GeneratorTargets).
                super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                ._M_impl;
    puVar9 = *(pointer *)
              ((long)&(pcVar2->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              + 8);
    local_160 = puVar11;
    local_148 = puVar9;
    while( true ) {
      if (puVar12 == puVar9) break;
      TVar6 = cmGeneratorTarget::GetType
                        ((cmGeneratorTarget *)
                         (puVar12->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        );
      if ((TVar6 < UTILITY) &&
         (bVar3 = cmGeneratorTarget::IsImported
                            ((cmGeneratorTarget *)
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ), !bVar3)) {
        cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a0,
                   (cmGeneratorTarget *)
                   (puVar12->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        cmGeneratorTarget::ClearSourcesCache
                  ((cmGeneratorTarget *)
                   (puVar12->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targetName,"CSharp",(allocator<char> *)&component);
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_a0,&targetName);
        std::__cxx11::string::~string((string *)&targetName);
        if (sVar8 == 0) {
          bVar3 = cmGeneratorTarget::GetPropertyAsBool
                            ((cmGeneratorTarget *)
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,local_198);
          bVar4 = cmGeneratorTarget::GetPropertyAsBool
                            ((cmGeneratorTarget *)
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,local_138);
          bVar5 = cmGeneratorTarget::GetPropertyAsBool
                            ((cmGeneratorTarget *)
                             (puVar12->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ,local_140);
          if ((bVar3 || bVar4) || bVar5) {
            local_190 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar12->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_168);
            local_150 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar12->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_170);
            local_158 = cmGeneratorTarget::GetSafeProperty
                                  ((cmGeneratorTarget *)
                                   (puVar12->_M_t).
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ,local_178);
            target.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (puVar12->_M_t).
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
            std::__cxx11::string::string((string *)&local_50,(string *)local_190);
            local_1c1 = bVar3;
            local_1c0[0] = cmQtAutoGenInitializer::GetQtVersion
                                     ((cmGeneratorTarget *)
                                      target.
                                      super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                      .super__Head_base<0UL,_cmGeneratorTarget_*,_false>.
                                      _M_head_impl,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            rcc = SUB81(in_R8,0);
            bVar14 = true;
            bVar13 = true;
            bVar3 = true;
            if (2 < local_1c0[0].first.Major - 4) {
              bVar13 = local_190->_M_string_length != 0;
              bVar14 = local_150->_M_string_length != 0;
              bVar3 = local_158->_M_string_length != 0;
            }
            mocIsValid = (bool)(local_1c1 & bVar13);
            uicIsValid = (bool)(bVar4 & bVar14);
            rccIsValid = (bool)(bVar5 & bVar3);
            bVar10 = (bVar13 ^ 1U) & local_1c1;
            bVar4 = (bool)((bVar14 ^ 1U) & bVar4);
            bVar5 = (bool)((bVar3 ^ 1U) & bVar5);
            if (((bVar4 != false) || (bVar10 != 0)) ||
               (this_01 = local_1a0, puVar9 = local_148, bVar3 = mocIsValid, bVar5 != false)) {
              if (local_1c0[0].second == 0) {
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)&targetName,"<QTVERSION>");
              }
              else {
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)&targetName,local_1c0[0].second);
              }
              str = "Widgets";
              if (bVar4 == false) {
                str = "Core";
              }
              cmAlphaNum::cmAlphaNum(&component,str);
              psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  (puVar12->_M_t).
                                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 );
              cmQtAutoGen::Tools_abi_cxx11_
                        (&local_70,(cmQtAutoGen *)(ulong)bVar10,bVar4,bVar5,(bool)rcc);
              in_R8 = &local_70;
              cmStrCat<char_const(&)[47],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[30],char_const(&)[18],cmAlphaNum&,char_const(&)[13],cmAlphaNum&,char_const(&)[3],char_const(&)[29]>
                        (&msg,(char (*) [47])"AUTOGEN: No valid Qt version found for target ",psVar7
                         ,(char (*) [4])0x79517d,&local_70,
                         (char (*) [30])" disabled.  Consider adding:\n",
                         (char (*) [18])"  find_package(Qt",(cmAlphaNum *)&targetName,
                         (char (*) [13])" COMPONENTS ",&component,(char (*) [3])0x7c272e,
                         (char (*) [29])"to your CMakeLists.txt file.");
              std::__cxx11::string::~string((string *)&local_70);
              cmMakefile::IssueMessage
                        (*(cmMakefile **)
                          ((long)(puVar12->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          + 8),AUTHOR_WARNING,&msg);
              std::__cxx11::string::~string((string *)&msg);
              this_01 = local_1a0;
              puVar9 = local_148;
              bVar3 = (bool)(mocIsValid & 1);
            }
            local_1a0 = this_01;
            local_148 = puVar9;
            if (((bVar3 != false) || (uicIsValid != false)) || (rccIsValid == true)) {
              msg._M_dataplus._M_p =
                   *(pointer *)
                    &(puVar12->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
              ;
              in_R8 = (string *)&mocIsValid;
              component.RValueString_ = (string *)this_01;
              std::
              make_unique<cmQtAutoGenInitializer,cmQtAutoGenGlobalInitializer*,cmGeneratorTarget*,cmQtAutoGen::IntegerVersion_const&,bool_const&,bool_const&,bool_const&,bool&,bool&>
                        ((cmQtAutoGenGlobalInitializer **)&targetName,
                         (cmGeneratorTarget **)&component,(IntegerVersion *)&msg,(bool *)local_1c0,
                         (bool *)in_R8,&uicIsValid,&rccIsValid,&globalAutoGenTarget);
              std::
              vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
              ::
              emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                        ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                          *)this_01,
                         (unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                          *)&targetName);
              std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
              ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                             *)&targetName);
              puVar9 = local_148;
            }
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_a0);
      }
      puVar12 = puVar12 + 1;
    }
    puVar11 = local_160 + 1;
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<std::unique_ptr<cmLocalGenerator>> const& localGenerators)
{
  for (const auto& localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile const* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTOGEN_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        this->GlobalAutoGenTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTORCC_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        this->GlobalAutoRccTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (const auto& target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }
      std::set<std::string> const& languages =
        target->GetAllConfigCompileLanguages();
      // cmGeneratorTarget::GetAllConfigCompileLanguages caches the target's
      // sources. Clear it so that OBJECT library targets that are AUTOGEN
      // initialized after this target get their added mocs_compilation.cpp
      // source acknowledged by this target.
      target->ClearSourcesCache();
      if (languages.count("CSharp")) {
        // Don't process target if it's a CSharp target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(this->kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(this->kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(this->kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const& mocExec =
          target->GetSafeProperty(this->kw().AUTOMOC_EXECUTABLE);
        std::string const& uicExec =
          target->GetSafeProperty(this->kw().AUTOUIC_EXECUTABLE);
        std::string const& rccExec =
          target->GetSafeProperty(this->kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto const qtVersion =
          cmQtAutoGenInitializer::GetQtVersion(target.get(), mocExec);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          cmAlphaNum version = (qtVersion.second == 0)
            ? cmAlphaNum("<QTVERSION>")
            : cmAlphaNum(qtVersion.second);
          cmAlphaNum component = uicDisabled ? "Widgets" : "Core";

          std::string const msg = cmStrCat(
            "AUTOGEN: No valid Qt version found for target ",
            target->GetName(), ".  ",
            cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled),
            " disabled.  Consider adding:\n", "  find_package(Qt", version,
            " COMPONENTS ", component, ")\n", "to your CMakeLists.txt file.");
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          this->Initializers_.emplace_back(
            cm::make_unique<cmQtAutoGenInitializer>(
              this, target.get(), qtVersion.first, mocIsValid, uicIsValid,
              rccIsValid, globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}